

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourcesDictionary.cpp
# Opt level: O3

void __thiscall ResourcesDictionary::ResourcesDictionary(ResourcesDictionary *this)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_ResourcesDictionary = (_func_int **)&PTR__ResourcesDictionary_003a88b8;
  p_Var1 = &(this->mProcsets)._M_t._M_impl.super__Rb_tree_header;
  (this->mProcsets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mProcsets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mProcsets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mProcsets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mProcsets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->mExtGStates)._M_t._M_impl.super__Rb_tree_header;
  (this->mExtGStates)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mExtGStates)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mExtGStates)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mExtGStates)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mExtGStates)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->mFonts)._M_t._M_impl.super__Rb_tree_header;
  (this->mFonts)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mFonts)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mFonts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mFonts)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mFonts)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->mColorSpaces)._M_t._M_impl.super__Rb_tree_header;
  (this->mColorSpaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mColorSpaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mColorSpaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mColorSpaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mColorSpaces)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->mPatterns)._M_t._M_impl.super__Rb_tree_header;
  (this->mPatterns)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mPatterns)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mPatterns)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mPatterns)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mPatterns)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->mProperties)._M_t._M_impl.super__Rb_tree_header;
  (this->mProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mProperties)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->mXObjects)._M_t._M_impl.super__Rb_tree_header;
  (this->mXObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mXObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mXObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mXObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mXObjects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->mShading)._M_t._M_impl.super__Rb_tree_header;
  (this->mShading)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mShading)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mShading)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mShading)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  this->mExtGStatesCount = 0;
  this->mFontsCount = 0;
  this->mColorSpacesCount = 0;
  this->mPatternsCount = 0;
  this->mPropertiesCount = 0;
  this->mFormXObjectsCount = 0;
  this->mImageXObjectsCount = 0;
  this->mGenericXObjectsCount = 0;
  (this->mShading)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->mShadingCount = 0;
  return;
}

Assistant:

ResourcesDictionary::ResourcesDictionary(void)
{
    mImageXObjectsCount = 0;
    mFormXObjectsCount = 0;
    mGenericXObjectsCount = 0;
    mExtGStatesCount = 0;
	mFontsCount = 0;
    mColorSpacesCount = 0;
    mPatternsCount = 0;
    mPropertiesCount = 0;
    mShadingCount = 0;

}